

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configmng.cpp
# Opt level: O0

void __thiscall banksia::Config::updateOption(Config *this,Option *o)

{
  bool bVar1;
  __type _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  Option *in_RDI;
  Option *option;
  iterator __end1;
  iterator __begin1;
  vector<banksia::Option,_std::allocator<banksia::Option>_> *__range1;
  Config *in_stack_ffffffffffffffd0;
  __normal_iterator<banksia::Option_*,_std::vector<banksia::Option,_std::allocator<banksia::Option>_>_>
  local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          ((long)&in_RDI[1].defaultString.field_2 + 8);
  local_20._M_current =
       (Option *)std::vector<banksia::Option,_std::allocator<banksia::Option>_>::begin(in_RDI);
  std::vector<banksia::Option,_std::allocator<banksia::Option>_>::end
            ((vector<banksia::Option,_std::allocator<banksia::Option>_> *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<banksia::Option_*,_std::vector<banksia::Option,_std::allocator<banksia::Option>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<banksia::Option_*,_std::vector<banksia::Option,_std::allocator<banksia::Option>_>_>
                        *)in_RDI);
    if (!bVar1) {
      appendOption(in_stack_ffffffffffffffd0,in_RDI);
      return;
    }
    in_stack_ffffffffffffffd0 =
         (Config *)
         __gnu_cxx::
         __normal_iterator<banksia::Option_*,_std::vector<banksia::Option,_std::allocator<banksia::Option>_>_>
         ::operator*(&local_20);
    _Var2 = std::operator==(in_RSI,__rhs);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<banksia::Option_*,_std::vector<banksia::Option,_std::allocator<banksia::Option>_>_>
    ::operator++(&local_20);
  }
  bVar1 = Option::operator!=((Option *)in_stack_ffffffffffffffd0,in_RDI);
  if (!bVar1) {
    return;
  }
  Option::update(__end1._M_current,option);
  return;
}

Assistant:

void Config::updateOption(const Option& o)
{
    for(auto && option : optionList) {
        if (option.name == o.name) {
            if (option != o) {
                option.update(o);
            }
            return;
        }
    }
    appendOption(o);
}